

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O2

void __thiscall tcu::DirArchive::~DirArchive(DirArchive *this)

{
  ~DirArchive(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

DirArchive::~DirArchive ()
{
}